

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radixsort.c
# Opt level: O2

uint32_t radixsort_u32(uint32_t kRadixBits,uint32_t *keys_in,uint32_t *keys_temp,uint32_t *values_in
                      ,uint32_t *values_temp,uint32_t size)

{
  uint uVar1;
  uint32_t *keys_in_00;
  uint32_t *keys_out;
  uint32_t *values_in_00;
  long lVar2;
  int iVar3;
  byte bVar4;
  uint32_t bucket_1;
  ulong uVar5;
  undefined4 in_register_0000008c;
  ulong uVar6;
  uint32_t *hist;
  uint32_t uVar7;
  uint mask;
  uint uVar8;
  uint32_t shift;
  undefined8 auStack_a0 [2];
  uint32_t auStack_90 [2];
  ulong local_88;
  uint32_t *local_80;
  uint32_t *local_78;
  uint32_t *local_70;
  uint32_t *local_68;
  uint32_t *keys [2];
  uint32_t *values [2];
  
  local_88 = 0x1f / (ulong)kRadixBits;
  iVar3 = (int)local_88;
  uVar8 = iVar3 + 1;
  auStack_90[0] = 1;
  auStack_90[1] = 0;
  bVar4 = (byte)kRadixBits;
  uVar7 = 1 << (bVar4 & 0x1f);
  lVar2 = -((ulong)(uVar8 << (bVar4 & 0x1f)) * 4 + 0xf & 0x3fffffff0);
  hist = (uint32_t *)((long)&local_88 + lVar2);
  local_80 = values_temp;
  local_78 = values_in;
  local_70 = keys_temp;
  *(undefined8 *)((long)auStack_90 + lVar2) = 0x137f50;
  memset(hist,0,(ulong)(iVar3 * 4 + 4) << (bVar4 & 0x3f));
  mask = uVar7 - 1;
  for (uVar6 = 0; uVar6 != size; uVar6 = uVar6 + 1) {
    uVar1 = keys_in[uVar6];
    iVar3 = 0;
    for (uVar5 = 0; uVar8 != uVar5; uVar5 = uVar5 + 1) {
      hist[(uVar5 << (bVar4 & 0x3f)) + (ulong)(uVar1 >> ((byte)iVar3 & 0x1f) & mask)] =
           hist[(uVar5 << (bVar4 & 0x3f)) + (ulong)(uVar1 >> ((byte)iVar3 & 0x1f) & mask)] + 1;
      iVar3 = iVar3 + kRadixBits;
    }
  }
  *(undefined8 *)((long)auStack_90 + lVar2) = 0x137fa5;
  sum_histograms(uVar8,uVar7,hist);
  local_68 = keys_in;
  keys[0] = local_70;
  keys[1] = local_78;
  shift = 0;
  uVar7 = 0;
  for (uVar8 = 0; uVar8 <= (uint)local_88; uVar8 = uVar8 + 1) {
    uVar7 = uVar8 & 1 ^ 1;
    uVar6 = (ulong)((uVar8 & 1) << 3);
    keys_in_00 = *(uint32_t **)((long)keys + (uVar6 - 8));
    keys_out = *(uint32_t **)((long)keys + ((ulong)(uVar7 * 8) - 8));
    values_in_00 = *(uint32_t **)((long)keys + uVar6 + 8);
    *(ulong *)((long)auStack_90 + lVar2) = CONCAT44(in_register_0000008c,size);
    *(undefined8 *)((long)auStack_a0 + lVar2 + 8) =
         *(undefined8 *)((long)keys + (ulong)(uVar7 * 8) + 8);
    *(undefined8 *)((long)auStack_a0 + lVar2) = 0x13801d;
    radixpass_u32(hist + (uVar8 << (bVar4 & 0x1f)),shift,mask,keys_in_00,keys_out,values_in_00,
                  *(uint32_t **)((long)auStack_a0 + lVar2 + 8),
                  *(uint32_t *)((long)auStack_90 + lVar2));
    shift = shift + kRadixBits;
  }
  return uVar7;
}

Assistant:

static inline uint32_t radixsort_u32(uint32_t kRadixBits, uint32_t* restrict keys_in,
    uint32_t* restrict keys_temp, uint32_t* restrict values_in, uint32_t* values_temp,
    uint32_t size)
{
    const uint32_t kHistBuckets = 1 + (((sizeof(uint32_t) * 8) - 1) / kRadixBits);
    const uint32_t kHistSize = 1 << kRadixBits;
    uint32_t hist[kHistBuckets * kHistSize];
    memset(hist, 0, sizeof(uint32_t) * kHistBuckets * kHistSize);

    init_histograms_u32(kRadixBits, kHistBuckets, kHistSize, hist, keys_in, size);

    sum_histograms(kHistBuckets, kHistSize, hist);

    // alternate input and output buffers on each radix pass
    uint32_t* restrict keys[2] = {keys_in, keys_temp};
    uint32_t* restrict values[2] = {values_in, values_temp};

    uint32_t out = 0;
    const uint32_t kHistMask = kHistSize - 1;
    for (uint32_t bucket = 0; bucket < kHistBuckets; ++bucket)
    {
        const uint32_t in = bucket & 1;
        out = !in;
        uint32_t* restrict offset = hist + (bucket * kHistSize);
        radixpass_u32(offset, bucket * kRadixBits, kHistMask, keys[in], keys[out], values[in],
            values[out], size);
    }

    return out;
}